

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrent_index.cpp
# Opt level: O1

void AppendToIntegers(DuckDB *db,atomic<bool> *success)

{
  char cVar1;
  char *__end;
  long lVar2;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  result;
  Connection con;
  long *local_80;
  atomic<bool> *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  Connection local_50 [32];
  
  local_78 = success;
  duckdb::Connection::Connection(local_50,db);
  lVar2 = 2000;
  do {
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"INSERT INTO integers VALUES (1)","");
    duckdb::Connection::Query((string *)&local_80);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_80);
    cVar1 = duckdb::BaseQueryResult::HasError();
    if (cVar1 != '\0') {
      LOCK();
      (local_78->_M_base)._M_i = false;
      UNLOCK();
    }
    if (local_80 != (long *)0x0) {
      (**(code **)(*local_80 + 8))();
    }
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  duckdb::Connection::~Connection(local_50);
  return;
}

Assistant:

static void AppendToIntegers(DuckDB *db, atomic<bool> *success) {
	Connection con(*db);
	for (idx_t i = 0; i < CONCURRENT_INDEX_INSERT_COUNT; i++) {
		auto result = con.Query("INSERT INTO integers VALUES (1)");
		if (result->HasError()) {
			*success = false;
		}
	}
}